

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Example.cpp
# Opt level: O2

void __thiscall Nova::Example<float,_3>::Log_Parameters(Example<float,_3> *this)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(this->output,"initial_time=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->initial_time);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(this->output,"frame_rate=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->frame_rate);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(this->output,"first_frame=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->first_frame);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(this->output,"last_frame=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->last_frame);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(this->output,"restart_frame=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->restart_frame);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(this->output,"write_substeps_level=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->write_substeps_level);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(this->output,"frame_title=");
  poVar1 = std::operator<<(poVar1,(string *)&this->frame_title);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(this->output,"output_directory=");
  poVar1 = std::operator<<(poVar1,(string *)&this->output_directory);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(this->output,"write_time=");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(this->output,"restart=");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(this->output,"write_output_files=");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(this->output,"write_frame_title=");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void Example<T,d>::
Log_Parameters() const
{
    *output<<"initial_time="<<initial_time<<std::endl;
    *output<<"frame_rate="<<frame_rate<<std::endl;
    *output<<"first_frame="<<first_frame<<std::endl;
    *output<<"last_frame="<<last_frame<<std::endl;
    *output<<"restart_frame="<<restart_frame<<std::endl;
    *output<<"write_substeps_level="<<write_substeps_level<<std::endl;
    *output<<"frame_title="<<frame_title<<std::endl;
    *output<<"output_directory="<<output_directory<<std::endl;
    *output<<"write_time="<<write_time<<std::endl;
    *output<<"restart="<<restart<<std::endl;
    *output<<"write_output_files="<<write_output_files<<std::endl;
    *output<<"write_frame_title="<<write_frame_title<<std::endl;
}